

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase124::run(TestCase124 *this)

{
  bool bVar1;
  ArrayPtr<int> AVar2;
  int *local_b8;
  int *local_b0;
  bool local_a1;
  int *piStack_a0;
  bool _kj_shouldLog;
  int *local_98;
  int *local_90;
  undefined1 local_88 [8];
  DebugComparison<int_*,_int_*> _kjCondition;
  ArrayPtr<int> arr2;
  undefined1 local_40 [8];
  ArrayPtr<int> arr1;
  Arena arena;
  TestCase124 *this_local;
  
  Arena::Arena((Arena *)&arr1.size_,0x400);
  AVar2 = Arena::allocateArray<int>((Arena *)&arr1.size_,0x10);
  arr1.ptr = (int *)AVar2.size_;
  local_40 = (undefined1  [8])AVar2.ptr;
  AVar2 = Arena::allocateArray<int>((Arena *)&arr1.size_,8);
  _kjCondition._32_8_ = AVar2.ptr;
  local_98 = ArrayPtr<int>::end((ArrayPtr<int> *)local_40);
  local_90 = (int *)kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_98);
  piStack_a0 = ArrayPtr<int>::begin((ArrayPtr<int> *)&_kjCondition.result);
  kj::_::DebugExpression<int*>::operator==
            ((DebugComparison<int_*,_int_*> *)local_88,(DebugExpression<int*> *)&local_90,
             &stack0xffffffffffffff60);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (!bVar1) {
    local_a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      local_b0 = ArrayPtr<int>::end((ArrayPtr<int> *)local_40);
      local_b8 = ArrayPtr<int>::begin((ArrayPtr<int> *)&_kjCondition.result);
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<int*,int*>&,int*,int*>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x82,ERROR,
                 "\"failed: expected \" \"(arr1.end()) == (arr2.begin())\", _kjCondition, arr1.end(), arr2.begin()"
                 ,(char (*) [48])"failed: expected (arr1.end()) == (arr2.begin())",
                 (DebugComparison<int_*,_int_*> *)local_88,&local_b0,&local_b8);
      local_a1 = false;
    }
  }
  Arena::~Arena((Arena *)&arr1.size_);
  return;
}

Assistant:

TEST(Arena, TrivialArray) {
  Arena arena;
  ArrayPtr<int> arr1 = arena.allocateArray<int>(16);
  ArrayPtr<int> arr2 = arena.allocateArray<int>(8);

  // Trivial arrays should be tightly-packed.
  EXPECT_EQ(arr1.end(), arr2.begin());
}